

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

void read_engr_at(int x,int y)

{
  boolean bVar1;
  int iVar2;
  engr *peVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  bool bVar7;
  char **ppcStack_130;
  uint maxelen;
  char *et;
  char buf [256];
  int sensed;
  engr *ep;
  int y_local;
  int x_local;
  
  peVar3 = engr_at(level,(xchar)x,(xchar)y);
  bVar7 = false;
  if (((peVar3 != (engr *)0x0) && (*peVar3->engr_txt != '\0')) &&
     ((flags.run != 8 || ((*(uint *)&level->locations[x][y].field_0x6 >> 2 & 1) == 0)))) {
    switch(peVar3->engr_type) {
    case '\x01':
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        bVar7 = true;
        bVar1 = is_ice(level,x,y);
        pcVar6 = "dust";
        if (bVar1 != '\0') {
          pcVar6 = "frost";
        }
        pline("Something is written here in the %s.",pcVar6);
      }
      break;
    case '\x02':
    case '\x06':
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          (bVar1 = can_reach_floor(), bVar1 != '\0')))) {
        bVar7 = true;
        pcVar6 = surface(x,y);
        pline("Something is engraved here on the %s.",pcVar6);
      }
      break;
    case '\x03':
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
          (bVar1 = can_reach_floor(), bVar1 != '\0')))) {
        bVar7 = true;
        bVar1 = is_ice(level,x,y);
        pcVar6 = "burned";
        if (bVar1 != '\0') {
          pcVar6 = "melted";
        }
        pcVar4 = surface(x,y);
        pline("Some text has been %s into the %s here.",pcVar6,pcVar4);
      }
      break;
    case '\x04':
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        bVar7 = true;
        pcVar6 = surface(x,y);
        pline("There\'s some graffiti on the %s here.",pcVar6);
      }
      break;
    case '\x05':
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        bVar7 = true;
        pline("You see a message scrawled in blood here.");
      }
      break;
    default:
      warning("Something is written in a very strange way.");
      bVar7 = true;
    }
    if (bVar7) {
      sVar5 = strlen(peVar3->engr_txt);
      if (sVar5 < 0xe8) {
        ppcStack_130 = (char **)peVar3->engr_txt;
      }
      else {
        strncpy((char *)&et,peVar3->engr_txt,0xe7);
        buf[0xdf] = '\0';
        ppcStack_130 = &et;
      }
      if ((u.roleplay.illiterate == '\0') || (iVar2 = strcmp((char *)ppcStack_130,"X"), iVar2 == 0))
      {
        if ((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
          bVar7 = false;
          if (ublindf != (obj *)0x0) {
            bVar7 = ublindf->oartifact == '\x1d';
          }
          bVar7 = (bool)(bVar7 ^ 1);
        }
        pcVar6 = "read";
        if (bVar7) {
          pcVar6 = "feel the words";
        }
        pline("You %s: \"%s\".",pcVar6,ppcStack_130);
      }
      else {
        pline("But you cannot read.");
      }
      if (1 < flags.run) {
        nomul(0,(char *)0x0);
      }
      if (5 < moves) {
        check_tutorial_message(0x14f);
      }
    }
  }
  return;
}

Assistant:

void read_engr_at(int x, int y)
{
	struct engr *ep = engr_at(level, x,y);
	int	sensed = 0;
	char buf[BUFSZ];
	
	/* Sensing an engraving does not require sight,
	 * nor does it necessarily imply comprehension (literacy).
	 */
	if (ep && ep->engr_txt[0] &&
	    /* Don't stop if travelling or autoexploring. */
	    !(flags.run == 8 && level->locations[x][y].mem_stepped)) {
	    switch(ep->engr_type) {
	    case DUST:
		if (!Blind) {
			sensed = 1;
			pline("Something is written here in the %s.",
				is_ice(level, x, y) ? "frost" : "dust");
		}
		break;
	    case ENGRAVE:
	    case HEADSTONE:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Something is engraved here on the %s.",
				surface(x,y));
		}
		break;
	    case BURN:
		if (!Blind || can_reach_floor()) {
			sensed = 1;
			pline("Some text has been %s into the %s here.",
				is_ice(level, x, y) ? "melted" : "burned",
				surface(x, y));
		}
		break;
	    case MARK:
		if (!Blind) {
			sensed = 1;
			pline("There's some graffiti on the %s here.",
				surface(x,y));
		}
		break;
	    case ENGR_BLOOD:
		/* "It's a message!  Scrawled in blood!"
		 * "What's it say?"
		 * "It says... `See you next Wednesday.'" -- Thriller
		 */
		if (!Blind) {
			sensed = 1;
			pline("You see a message scrawled in blood here.");
		}
		break;
	    default:
		warning("Something is written in a very strange way.");
		sensed = 1;
	    }
	    if (sensed) {
		char *et;
		unsigned maxelen = BUFSZ - sizeof("You feel the words: \"\". ");
		if (strlen(ep->engr_txt) > maxelen) {
			strncpy(buf,  ep->engr_txt, (int)maxelen);
			buf[maxelen] = '\0';
			et = buf;
		} else
			et = ep->engr_txt;
		if (u.roleplay.illiterate && strcmp(et, "X")) {
		    pline("But you cannot read.");
		} else {
		    pline("You %s: \"%s\".",
			  (Blind) ? "feel the words" : "read",  et);
		}
		if (flags.run > 1) nomul(0, NULL);
		if (moves > 5) check_tutorial_message(QT_T_ENGRAVING);
	    }
	}
}